

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_post_write_tile
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 *pOVar1;
  opj_tcd *poVar2;
  bool bVar3;
  OPJ_BOOL OVar4;
  OPJ_UINT32 OVar5;
  int iVar6;
  OPJ_SIZE_T OVar7;
  OPJ_UINT32 OVar8;
  ulong uVar9;
  opj_cp_t *poVar10;
  ulong uVar11;
  opj_j2k_t *poVar12;
  opj_stream_private_t *p_stream_00;
  OPJ_UINT32 OVar13;
  uint p_value;
  opj_event_mgr_t *poVar14;
  OPJ_BYTE *pOVar15;
  OPJ_UINT32 l_current_nb_bytes_written_1;
  OPJ_UINT32 l_current_nb_bytes_written;
  OPJ_UINT32 local_90;
  OPJ_UINT32 local_8c;
  undefined8 local_88;
  opj_j2k_t *local_80;
  opj_event_mgr_t *local_78;
  OPJ_UINT32 local_6c;
  opj_stream_private_t *local_68;
  OPJ_UINT32 local_60;
  OPJ_UINT32 local_5c;
  opj_cp_t *local_58;
  OPJ_UINT32 *local_50;
  opj_tcp_t *local_48;
  opj_tcd *local_40;
  ulong local_38;
  
  pOVar15 = (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data;
  if (pOVar15 == (OPJ_BYTE *)0x0) {
    __assert_fail("p_j2k->m_specific_param.m_encoder.m_encoded_tile_data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2d30,
                  "OPJ_BOOL opj_j2k_post_write_tile(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  OVar8 = (p_j2k->m_specific_param).m_encoder.m_encoded_tile_size;
  poVar2 = p_j2k->m_tcd;
  poVar10 = &p_j2k->m_cp;
  poVar2->cur_pino = 0;
  (p_j2k->m_specific_param).m_decoder.m_state = 0;
  local_6c = 0;
  local_80 = p_j2k;
  local_78 = p_manager;
  OVar4 = opj_j2k_write_sot(p_j2k,pOVar15,OVar8,&local_6c,p_stream,p_manager);
  OVar13 = local_6c;
  bVar3 = true;
  local_8c = OVar8;
  local_88 = pOVar15;
  local_58 = poVar10;
  if (OVar4 == 0) {
    local_38 = 0;
  }
  else {
    pOVar15 = pOVar15 + local_6c;
    OVar8 = OVar8 - local_6c;
    local_68 = (opj_stream_private_t *)poVar2;
    if ((3 < (ushort)((short)*(undefined4 *)poVar10 - 3U)) &&
       (((local_80->m_cp).tcps[local_80->m_current_tile_number].field_0x1638 & 4) != 0)) {
      local_6c = 0;
      opj_j2k_write_poc_in_memory(local_80,pOVar15,&local_6c,local_78);
      pOVar15 = pOVar15 + local_6c;
      OVar8 = OVar8 - local_6c;
      OVar13 = OVar13 + local_6c;
    }
    local_6c = 0;
    OVar4 = opj_j2k_write_sod(local_80,(opj_tcd_t *)local_68,pOVar15,&local_6c,OVar8,p_stream,
                              local_78);
    poVar10 = local_58;
    local_38 = 0;
    if (OVar4 != 0) {
      p_value = OVar13 + local_6c;
      opj_write_bytes_LE(local_88 + 6,p_value,4);
      if ((ushort)((short)*(undefined4 *)poVar10 - 3U) < 4) {
        opj_j2k_update_tlm(local_80,p_value);
      }
      bVar3 = false;
      local_38 = (ulong)p_value;
    }
  }
  poVar12 = local_80;
  if (bVar3) {
    return 0;
  }
  pOVar15 = local_88 + local_38;
  local_8c = local_8c - (int)local_38;
  local_40 = local_80->m_tcd;
  local_48 = (local_80->m_cp).tcps;
  local_50 = (OPJ_UINT32 *)(ulong)local_80->m_current_tile_number;
  local_60 = opj_j2k_get_num_tp(poVar10,0,local_80->m_current_tile_number);
  pOVar1 = &(poVar12->m_specific_param).m_encoder.m_current_tile_part_number;
  *pOVar1 = *pOVar1 + 1;
  OVar8 = local_8c;
  local_68 = p_stream;
  if (local_60 < 2) {
    local_88 = (OPJ_BYTE *)((ulong)local_88._4_4_ << 0x20);
  }
  else {
    OVar13 = 1;
    local_88 = (OPJ_BYTE *)((ulong)local_88._4_4_ << 0x20);
    do {
      p_stream_00 = local_68;
      (poVar12->m_specific_param).m_decoder.m_state = OVar13;
      local_90 = 0;
      local_5c = OVar13;
      OVar4 = opj_j2k_write_sot(poVar12,pOVar15,OVar8,&local_90,local_68,local_78);
      OVar13 = local_90;
      bVar3 = true;
      if (OVar4 == 0) {
        poVar14 = local_78;
        iVar6 = 0;
        goto LAB_0011404c;
      }
      uVar11 = (ulong)local_90;
      local_8c = OVar8 - local_90;
      local_90 = 0;
      OVar4 = opj_j2k_write_sod(poVar12,local_40,pOVar15 + uVar11,&local_90,local_8c,p_stream_00,
                                local_78);
      OVar8 = local_90;
      if (OVar4 == 0) goto LAB_0011404a;
      uVar9 = (ulong)local_90;
      OVar5 = local_90 + OVar13;
      opj_write_bytes_LE(pOVar15 + 6,OVar5,4);
      poVar12 = local_80;
      if ((ushort)((short)*(undefined4 *)local_58 - 3U) < 4) {
        opj_j2k_update_tlm(local_80,OVar5);
      }
      pOVar15 = pOVar15 + uVar11 + uVar9;
      local_88 = (OPJ_BYTE *)CONCAT44(local_88._4_4_,(int)local_88 + OVar13 + OVar8);
      pOVar1 = &(poVar12->m_specific_param).m_encoder.m_current_tile_part_number;
      *pOVar1 = *pOVar1 + 1;
      OVar8 = local_8c - OVar8;
      OVar13 = local_5c + 1;
    } while (local_60 != OVar13);
  }
  poVar14 = local_78;
  if (local_48[(long)local_50].numpocs == 0) {
    bVar3 = false;
    p_stream_00 = local_68;
    iVar6 = (int)local_88;
  }
  else {
    local_50 = &local_48[(long)local_50].numpocs;
    OVar13 = 1;
    poVar10 = local_58;
    do {
      local_40->cur_pino = OVar13;
      local_48 = (opj_tcp_t *)CONCAT44(local_48._4_4_,OVar13);
      local_60 = opj_j2k_get_num_tp(poVar10,OVar13,local_80->m_current_tile_number);
      if (local_60 != 0) {
        OVar13 = 0;
        do {
          p_stream_00 = local_68;
          poVar12 = local_80;
          (local_80->m_specific_param).m_decoder.m_state = OVar13;
          local_90 = 0;
          local_5c = OVar13;
          OVar4 = opj_j2k_write_sot(local_80,pOVar15,OVar8,&local_90,local_68,poVar14);
          OVar13 = local_90;
          bVar3 = true;
          if (OVar4 == 0) {
            iVar6 = 0;
            goto LAB_0011404c;
          }
          uVar11 = (ulong)local_90;
          local_8c = OVar8 - local_90;
          local_90 = 0;
          OVar4 = opj_j2k_write_sod(poVar12,local_40,pOVar15 + uVar11,&local_90,local_8c,p_stream_00
                                    ,poVar14);
          OVar8 = local_90;
          if (OVar4 == 0) goto LAB_0011404a;
          uVar9 = (ulong)local_90;
          OVar5 = OVar13 + local_90;
          opj_write_bytes_LE(pOVar15 + 6,OVar5,4);
          poVar10 = local_58;
          if ((ushort)((short)*(undefined4 *)local_58 - 3U) < 4) {
            opj_j2k_update_tlm(local_80,OVar5);
          }
          local_88 = (OPJ_BYTE *)CONCAT44(local_88._4_4_,(int)local_88 + OVar13 + OVar8);
          pOVar15 = pOVar15 + uVar11 + uVar9;
          pOVar1 = &(local_80->m_specific_param).m_encoder.m_current_tile_part_number;
          *pOVar1 = *pOVar1 + 1;
          OVar8 = local_8c - OVar8;
          OVar13 = local_5c + 1;
          poVar14 = local_78;
        } while (local_60 != OVar13);
      }
      OVar13 = (int)local_48 + 1;
      bVar3 = false;
      p_stream_00 = local_68;
      iVar6 = (int)local_88;
    } while (OVar13 <= *local_50);
  }
LAB_0011404c:
  OVar4 = 0;
  if ((!bVar3) &&
     (uVar11 = (ulong)(uint)((int)local_38 + iVar6),
     OVar7 = opj_stream_write_data
                       (p_stream_00,(local_80->m_specific_param).m_encoder.m_encoded_tile_data,
                        uVar11,poVar14), OVar7 == uVar11)) {
    local_80->m_current_tile_number = local_80->m_current_tile_number + 1;
    OVar4 = 1;
  }
  return OVar4;
LAB_0011404a:
  bVar3 = true;
  p_stream_00 = local_68;
  poVar14 = local_78;
  iVar6 = 0;
  goto LAB_0011404c;
}

Assistant:

static OPJ_BOOL opj_j2k_post_write_tile(opj_j2k_t * p_j2k,
                                        opj_stream_private_t *p_stream,
                                        opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 l_nb_bytes_written;
    OPJ_BYTE * l_current_data = 00;
    OPJ_UINT32 l_tile_size = 0;
    OPJ_UINT32 l_available_data;

    /* preconditions */
    assert(p_j2k->m_specific_param.m_encoder.m_encoded_tile_data);

    l_tile_size = p_j2k->m_specific_param.m_encoder.m_encoded_tile_size;
    l_available_data = l_tile_size;
    l_current_data = p_j2k->m_specific_param.m_encoder.m_encoded_tile_data;

    l_nb_bytes_written = 0;
    if (! opj_j2k_write_first_tile_part(p_j2k, l_current_data, &l_nb_bytes_written,
                                        l_available_data, p_stream, p_manager)) {
        return OPJ_FALSE;
    }
    l_current_data += l_nb_bytes_written;
    l_available_data -= l_nb_bytes_written;

    l_nb_bytes_written = 0;
    if (! opj_j2k_write_all_tile_parts(p_j2k, l_current_data, &l_nb_bytes_written,
                                       l_available_data, p_stream, p_manager)) {
        return OPJ_FALSE;
    }

    l_available_data -= l_nb_bytes_written;
    l_nb_bytes_written = l_tile_size - l_available_data;

    if (opj_stream_write_data(p_stream,
                              p_j2k->m_specific_param.m_encoder.m_encoded_tile_data,
                              l_nb_bytes_written, p_manager) != l_nb_bytes_written) {
        return OPJ_FALSE;
    }

    ++p_j2k->m_current_tile_number;

    return OPJ_TRUE;
}